

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display_texture.hpp
# Opt level: O3

int display_texture::init(EVP_PKEY_CTX *ctx)

{
  void *__dest;
  undefined8 *puVar1;
  char *attribs [1];
  char *local_8;
  
  (*glad_glGenVertexArrays)(1,&vao);
  (*glad_glBindVertexArray)(vao);
  (*glad_glGenBuffers)(1,&vbo);
  (*glad_glBindBuffer)(0x8892,vbo);
  (*glad_glBufferData)(0x8892,0x48,(void *)0x0,0x88e4);
  __dest = (*glad_glMapBuffer)(0x8892,0x88b9);
  if (__dest == (void *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/display_texture.hpp"
                  ,0x15,"void display_texture::init()");
  }
  memcpy(__dest,&DAT_0018fd70,0x48);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  local_8 = "a_position";
  program = s_loadProgram("\n\t\t\t#version 410 core\n\t\t\tin vec3 a_position;\n\t\t\tout vec3 f_position;\n\n\t\t\tvoid main()\n\t\t\t{\n    \t\t\tgl_Position = vec4(a_position, 1.0);\n\t\t\t    f_position = vec3(a_position.x*0.5+0.5, a_position.y*0.5+0.5, 0.0);\n\t\t\t}\n\n\t\t"
                          ,
                          "\n\n\t\t\t#version 410 core\n\n\t\t\tin vec3 f_position;\n\t\t\tout vec4 o_color;\n\t\t\tuniform samplerCubeArray u_map;\n\t\t\t// uniform sampler2D u_map;\n\n\t\t\tvoid main()\n\t\t\t{\n\t\t\t    o_color = 0.1 * texture(u_map, vec4(normalize(vec3(a_normal.xy, 1)),i));\n\t\t\t    // o_color = vec4(f_position, 0.0);\n\t\t\t}\n\n\t\t"
                          ,&local_8,1);
  if (program != 0) {
    return (int)local_8;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Error loading mesh shader";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

void init()
	{
		int positionsSize = 6 *  sizeof(m_vec3);
		m_vec3 positions[] = {{-1,-1,0}, {1,-1,0}, {-1,1,0}, {-1,1,0}, {1,-1,0}, {1,1,0}};

		// upload geometry to opengl
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);

		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glBufferData(GL_ARRAY_BUFFER, positionsSize, NULL, GL_STATIC_DRAW);
		unsigned char *buffer = (unsigned char*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
		assert(buffer);
		memcpy(buffer, positions, positionsSize);
		glUnmapBuffer(GL_ARRAY_BUFFER);

		glEnableVertexAttribArray(0);
		glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, (void*)0);


		const char *attribs[] =
		{
			"a_position"
		};

		const char *vp = R"(
			#version 410 core
			in vec3 a_position;
			out vec3 f_position;

			void main()
			{
    			gl_Position = vec4(a_position, 1.0);
			    f_position = vec3(a_position.x*0.5+0.5, a_position.y*0.5+0.5, 0.0);
			}

		)";

		const char *fp = R"(

			#version 410 core

			in vec3 f_position;
			out vec4 o_color;
			uniform samplerCubeArray u_map;
			// uniform sampler2D u_map;

			void main()
			{
			    o_color = 0.1 * texture(u_map, vec4(normalize(vec3(a_normal.xy, 1)),i));
			    // o_color = vec4(f_position, 0.0);
			}

		)";

		program = s_loadProgram(vp, fp, attribs, 1);
		if (!program)
		{
			throw "Error loading mesh shader";
		}
	}